

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O2

void __thiscall
GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>::GetSPoly
          (CritPair<45UL,_GF2::MOGrlex<45UL>_> *this,MP<45UL,_GF2::MOGrlex<45UL>_> *spoly)

{
  size_t i;
  _List_node_base *p_Var1;
  
  MP<45UL,_GF2::MOGrlex<45UL>_>::operator=
            (spoly,(MP<45UL,_GF2::MOGrlex<45UL>_> *)((this->field_1).iter2._M_node + 1));
  i = (this->field_0).var1;
  if (i == 0xffffffffffffffff) {
    MP<45UL,_GF2::MOGrlex<45UL>_>::SPoly
              (spoly,(MP<45UL,_GF2::MOGrlex<45UL>_> *)((this->field_0).iter1._M_node + 1));
    return;
  }
  MP<45UL,_GF2::MOGrlex<45UL>_>::SPoly(spoly,i);
  if (((spoly->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
       super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node._M_size != 0
      ) && (p_Var1 = (this->field_1).iter2._M_node,
           (spoly->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
           super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next[1]._M_next == p_Var1[1]._M_next[1]._M_next)) {
    MP<45UL,_GF2::MOGrlex<45UL>_>::SymDiff(spoly,(MP<45UL,_GF2::MOGrlex<45UL>_> *)(p_Var1 + 1));
    return;
  }
  return;
}

Assistant:

void GetSPoly(MP<_n, _O>& spoly) const
	{
		spoly.SetOrder(iter2->GetOrder());
		spoly = *iter2;
		if (var1 == SIZE_MAX)
			// S-многочлен для пары явных многочленов
			spoly.SPoly(*iter1);
		else
		{
			// S(x_i^2-x_i, f) = f x_i mod (x_i^2-x_i)
			spoly.SPoly(var1);
			if (spoly != 0 && spoly.LM() == iter2->LM())
				spoly += *iter2;
		}
	}